

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1555.c
# Opt level: O0

int progressCallback(void *arg,double dltotal,double dlnow,double ultotal,double ulnow)

{
  undefined4 uVar1;
  CURLcode res;
  double ulnow_local;
  double ultotal_local;
  double dlnow_local;
  double dltotal_local;
  void *arg_local;
  
  uVar1 = curl_easy_recv(curl,0,0);
  curl_mprintf("curl_easy_recv returned %d\n",uVar1);
  uVar1 = curl_easy_send(curl,0,0);
  curl_mprintf("curl_easy_send returned %d\n",uVar1);
  return 1;
}

Assistant:

static int progressCallback(void *arg,
                            double dltotal,
                            double dlnow,
                            double ultotal,
                            double ulnow)
{
  CURLcode res = 0;
  (void)arg;
  (void)dltotal;
  (void)dlnow;
  (void)ultotal;
  (void)ulnow;
  res = curl_easy_recv(curl, NULL, 0, NULL);
  printf("curl_easy_recv returned %d\n", res);
  res = curl_easy_send(curl, NULL, 0, NULL);
  printf("curl_easy_send returned %d\n", res);

  return 1;
}